

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_parse.cc
# Opt level: O0

void yy_symbol_value_print(FILE *yyo,yysymbol_kind_t yykind,YYSTYPE *yyvaluep)

{
  FILE *yyoutput;
  YYSTYPE *yyvaluep_local;
  yysymbol_kind_t yykind_local;
  FILE *yyo_local;
  
  return;
}

Assistant:

static void
yy_symbol_value_print (FILE *yyo,
                       yysymbol_kind_t yykind, YYSTYPE const * const yyvaluep)
{
  FILE *yyoutput = yyo;
  YY_USE (yyoutput);
  if (!yyvaluep)
    return;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  YY_USE (yykind);
  YY_IGNORE_MAYBE_UNINITIALIZED_END
}